

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  XmlOutput *pXVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_978;
  xml_output local_960;
  QArrayDataPointer<char16_t> local_928;
  xml_output local_908;
  xml_output local_8d0;
  xml_output local_898;
  xml_output local_860;
  xml_output local_828;
  xml_output local_7f0;
  QArrayDataPointer<char16_t> local_7b8;
  xml_output local_7a0;
  xml_output local_768;
  xml_output local_730;
  QArrayDataPointer<char16_t> local_6f8;
  xml_output local_6d8;
  xml_output local_6a0;
  xml_output local_668;
  xml_output local_630;
  xml_output local_5f8;
  xml_output local_5c0;
  xml_output local_588;
  xml_output local_550;
  xml_output local_518;
  xml_output local_4e0;
  xml_output local_4a8;
  xml_output local_470;
  xml_output local_438;
  xml_output local_400;
  xml_output local_3c8;
  xml_output local_390;
  xml_output local_358;
  xml_output local_320;
  xml_output local_2e8;
  xml_output local_2b0;
  QArrayDataPointer<char16_t> local_278;
  xml_output local_258;
  xml_output local_220;
  QArrayDataPointer<char16_t> local_1e8;
  xml_output local_1d0;
  xml_output local_198;
  xml_output local_160;
  xml_output local_128;
  xml_output local_f0;
  xml_output local_b8;
  QArrayDataPointer<char16_t> local_80;
  xml_output local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_80,"Midl");
  tag(&local_68,(QString *)&local_80);
  pXVar2 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_68);
  attrTagX(&local_b8,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),";");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_b8);
  attrTagX(&local_f0,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_f0);
  attrTagT(&local_128,"ApplicationConfigurationMode",*(triState *)((long)__buf + 0x194));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_128);
  attrTagS(&local_160,"ClientStubFile",(QString *)((long)__buf + 0x1b0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_160);
  attrTagX(&local_198,"CPreprocessOptions",(QStringList *)((long)__buf + 0x38)," ");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_198);
  iVar1 = *(int *)((long)__buf + 0x50);
  if (iVar1 == 2) {
    pcVar3 = "Ascii";
LAB_001a7103:
    QString::QString((QString *)&local_1e8,pcVar3);
  }
  else {
    if (iVar1 == 1) {
      pcVar3 = "Signed";
      goto LAB_001a7103;
    }
    if (iVar1 == 0) {
      pcVar3 = "Unsigned";
      goto LAB_001a7103;
    }
    local_1e8.d = (Data *)0x0;
    local_1e8.ptr = (char16_t *)0x0;
    local_1e8.size = 0;
  }
  attrTagS(&local_1d0,"DefaultCharType",(QString *)&local_1e8);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_1d0);
  attrTagS(&local_220,"DLLDataFileName",(QString *)((long)__buf + 0x58));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_220);
  if (*(int *)((long)__buf + 0x70) == 2) {
    pcVar3 = "All";
LAB_001a7199:
    QString::QString((QString *)&local_278,pcVar3);
  }
  else {
    if (*(int *)((long)__buf + 0x70) == 1) {
      pcVar3 = "None";
      goto LAB_001a7199;
    }
    local_278.d = (Data *)0x0;
    local_278.ptr = (char16_t *)0x0;
    local_278.size = 0;
  }
  attrTagS(&local_258,"EnableErrorChecks",(QString *)&local_278);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_258);
  attrTagT(&local_2b0,"ErrorCheckAllocations",*(triState *)((long)__buf + 0x74));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_2b0);
  attrTagT(&local_2e8,"ErrorCheckBounds",*(triState *)((long)__buf + 0x78));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_2e8);
  attrTagT(&local_320,"ErrorCheckEnumRange",*(triState *)((long)__buf + 0x7c));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_320);
  attrTagT(&local_358,"ErrorCheckRefPointers",*(triState *)((long)__buf + 0x80));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_358);
  attrTagT(&local_390,"ErrorCheckStubData",*(triState *)((long)__buf + 0x84));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_390);
  attrTagS(&local_3c8,"GenerateClientFiles",(QString *)((long)__buf + 0x198));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_3c8);
  attrTagS(&local_400,"GenerateServerFiles",(QString *)((long)__buf + 0x1e8));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_400);
  attrTagT(&local_438,"GenerateStublessProxies",*(triState *)((long)__buf + 0xa0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_438);
  attrTagT(&local_470,"GenerateTypeLibrary",*(triState *)((long)__buf + 0xa4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_470);
  attrTagS(&local_4a8,"HeaderFileName",(QString *)((long)__buf + 0xa8));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_4a8);
  attrTagT(&local_4e0,"IgnoreStandardIncludePath",*(triState *)((long)__buf + 0xc0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_4e0);
  attrTagS(&local_518,"InterfaceIdentifierFileName",(QString *)((long)__buf + 200));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_518);
  attrTagL(&local_550,"LocaleID",*(qint64 *)((long)__buf + 0x218),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_550);
  attrTagT(&local_588,"MkTypLibCompatible",*(triState *)((long)__buf + 0xe0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_588);
  attrTagS(&local_5c0,"OutputDirectory",(QString *)((long)__buf + 0xe8));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_5c0);
  attrTagX(&local_5f8,"PreprocessorDefinitions",(QStringList *)((long)__buf + 0x100),";");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_5f8);
  attrTagS(&local_630,"ProxyFileName",(QString *)((long)__buf + 0x118));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_630);
  attrTagS(&local_668,"RedirectOutputAndErrors",(QString *)((long)__buf + 0x130));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_668);
  attrTagS(&local_6a0,"ServerStubFile",(QString *)((long)__buf + 0x200));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_6a0);
  switch(*(undefined4 *)((long)__buf + 0x148)) {
  case 1:
    pcVar3 = "1";
    break;
  case 2:
    pcVar3 = "2";
    break;
  case 3:
    pcVar3 = "4";
    break;
  case 4:
    pcVar3 = "8";
    break;
  case 5:
    pcVar3 = "16";
    break;
  default:
    local_6f8.d = (Data *)0x0;
    local_6f8.ptr = (char16_t *)0x0;
    local_6f8.size = 0;
    goto LAB_001a757f;
  }
  QString::QString((QString *)&local_6f8,pcVar3);
LAB_001a757f:
  attrTagS(&local_6d8,"StructMemberAlignment",(QString *)&local_6f8);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_6d8);
  attrTagT(&local_730,"SuppressCompilerWarnings",*(triState *)((long)__buf + 0x1e4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_730);
  attrTagT(&local_768,"SuppressStartupBanner",*(triState *)((long)__buf + 0x14c));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_768);
  if (*(int *)((long)__buf + 0x150) == 2) {
    pcVar3 = "X64";
LAB_001a7622:
    QString::QString((QString *)&local_7b8,pcVar3);
  }
  else {
    if (*(int *)((long)__buf + 0x150) == 1) {
      pcVar3 = "Win32";
      goto LAB_001a7622;
    }
    local_7b8.d = (Data *)0x0;
    local_7b8.ptr = (char16_t *)0x0;
    local_7b8.size = 0;
  }
  attrTagS(&local_7a0,"TargetEnvironment",(QString *)&local_7b8);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_7a0);
  attrTagS(&local_7f0,"TypeLibFormat",(QString *)((long)__buf + 0x1c8));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_7f0);
  attrTagS(&local_828,"TypeLibraryName",(QString *)((long)__buf + 0x158));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_828);
  attrTagX(&local_860,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x170),";");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_860);
  attrTagT(&local_898,"ValidateAllParameters",*(triState *)((long)__buf + 0x1e0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_898);
  attrTagT(&local_8d0,"WarnAsError",*(triState *)((long)__buf + 0x18c));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_8d0);
  switch(*(undefined4 *)((long)__buf + 400)) {
  case 0:
    pcVar3 = "0";
    break;
  case 1:
    pcVar3 = "1";
    break;
  case 2:
    pcVar3 = "2";
    break;
  case 3:
    pcVar3 = "3";
    break;
  case 4:
    pcVar3 = "4";
    break;
  default:
    local_928.d = (Data *)0x0;
    local_928.ptr = (char16_t *)0x0;
    local_928.size = 0;
    goto LAB_001a77a9;
  }
  QString::QString((QString *)&local_928,pcVar3);
LAB_001a77a9:
  attrTagS(&local_908,"WarningLevel",(QString *)&local_928);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_908);
  QString::QString((QString *)&QStack_978,"Midl");
  closetag(&local_960,(QString *)&QStack_978);
  XmlOutput::operator<<(pXVar2,&local_960);
  XmlOutput::xml_output::~xml_output(&local_960);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_978);
  XmlOutput::xml_output::~xml_output(&local_908);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_928);
  XmlOutput::xml_output::~xml_output(&local_8d0);
  XmlOutput::xml_output::~xml_output(&local_898);
  XmlOutput::xml_output::~xml_output(&local_860);
  XmlOutput::xml_output::~xml_output(&local_828);
  XmlOutput::xml_output::~xml_output(&local_7f0);
  XmlOutput::xml_output::~xml_output(&local_7a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_7b8);
  XmlOutput::xml_output::~xml_output(&local_768);
  XmlOutput::xml_output::~xml_output(&local_730);
  XmlOutput::xml_output::~xml_output(&local_6d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_6f8);
  XmlOutput::xml_output::~xml_output(&local_6a0);
  XmlOutput::xml_output::~xml_output(&local_668);
  XmlOutput::xml_output::~xml_output(&local_630);
  XmlOutput::xml_output::~xml_output(&local_5f8);
  XmlOutput::xml_output::~xml_output(&local_5c0);
  XmlOutput::xml_output::~xml_output(&local_588);
  XmlOutput::xml_output::~xml_output(&local_550);
  XmlOutput::xml_output::~xml_output(&local_518);
  XmlOutput::xml_output::~xml_output(&local_4e0);
  XmlOutput::xml_output::~xml_output(&local_4a8);
  XmlOutput::xml_output::~xml_output(&local_470);
  XmlOutput::xml_output::~xml_output(&local_438);
  XmlOutput::xml_output::~xml_output(&local_400);
  XmlOutput::xml_output::~xml_output(&local_3c8);
  XmlOutput::xml_output::~xml_output(&local_390);
  XmlOutput::xml_output::~xml_output(&local_358);
  XmlOutput::xml_output::~xml_output(&local_320);
  XmlOutput::xml_output::~xml_output(&local_2e8);
  XmlOutput::xml_output::~xml_output(&local_2b0);
  XmlOutput::xml_output::~xml_output(&local_258);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_278);
  XmlOutput::xml_output::~xml_output(&local_220);
  XmlOutput::xml_output::~xml_output(&local_1d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
  XmlOutput::xml_output::~xml_output(&local_198);
  XmlOutput::xml_output::~xml_output(&local_160);
  XmlOutput::xml_output::~xml_output(&local_128);
  XmlOutput::xml_output::~xml_output(&local_f0);
  XmlOutput::xml_output::~xml_output(&local_b8);
  XmlOutput::xml_output::~xml_output(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCMIDLTool &tool)
{
    xml
        << tag(_Midl)
            << attrTagX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagT(_ApplicationConfigurationMode, tool.ApplicationConfigurationMode)
            << attrTagS(_ClientStubFile, tool.ClientStubFile)
            << attrTagX(_CPreprocessOptions, tool.CPreprocessOptions, " ")
            << attrTagS(_DefaultCharType, toString(tool.DefaultCharType))
            << attrTagS(_DLLDataFileName, tool.DLLDataFileName)
            << attrTagS(_EnableErrorChecks, toString(tool.EnableErrorChecks))
            << attrTagT(_ErrorCheckAllocations, tool.ErrorCheckAllocations)
            << attrTagT(_ErrorCheckBounds, tool.ErrorCheckBounds)
            << attrTagT(_ErrorCheckEnumRange, tool.ErrorCheckEnumRange)
            << attrTagT(_ErrorCheckRefPointers, tool.ErrorCheckRefPointers)
            << attrTagT(_ErrorCheckStubData, tool.ErrorCheckStubData)
            << attrTagS(_GenerateClientFiles, tool.GenerateClientFiles)
            << attrTagS(_GenerateServerFiles, tool.GenerateServerFiles)
            << attrTagT(_GenerateStublessProxies, tool.GenerateStublessProxies)
            << attrTagT(_GenerateTypeLibrary, tool.GenerateTypeLibrary)
            << attrTagS(_HeaderFileName, tool.HeaderFileName)
            << attrTagT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
            << attrTagS(_InterfaceIdentifierFileName, tool.InterfaceIdentifierFileName)
            << attrTagL(_LocaleID, tool.LocaleID, /*ifNot*/ -1)
            << attrTagT(_MkTypLibCompatible, tool.MkTypLibCompatible)
            << attrTagS(_OutputDirectory, tool.OutputDirectory)
            << attrTagX(_PreprocessorDefinitions, tool.PreprocessorDefinitions, ";")
            << attrTagS(_ProxyFileName, tool.ProxyFileName)
            << attrTagS(_RedirectOutputAndErrors, tool.RedirectOutputAndErrors)
            << attrTagS(_ServerStubFile, tool.ServerStubFile)
            << attrTagS(_StructMemberAlignment, toString(tool.StructMemberAlignment))
            << attrTagT(_SuppressCompilerWarnings, tool.SuppressCompilerWarnings)
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
            << attrTagS(_TargetEnvironment, toString(tool.TargetEnvironment))
            << attrTagS(_TypeLibFormat, tool.TypeLibFormat)
            << attrTagS(_TypeLibraryName, tool.TypeLibraryName)
            << attrTagX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions, ";")
            << attrTagT(_ValidateAllParameters, tool.ValidateAllParameters)
            << attrTagT(_WarnAsError, tool.WarnAsError)
            << attrTagS(_WarningLevel, toString(tool.WarningLevel))
        << closetag(_Midl);
}